

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

TimerTickResult __thiscall tonk::Connection::onTimerTick(Connection *this)

{
  SessionOutgoing *this_00;
  int *piVar1;
  uint16_t port;
  uint64_t uVar2;
  MappedPortLifetime *pMVar3;
  bool bVar4;
  TimerTickResult TVar5;
  uint uVar6;
  uint64_t nowUsec;
  ErrorResult *pEVar7;
  char cVar8;
  int iVar9;
  byte bVar10;
  bool messageSent;
  int recoveryBytesSent;
  undefined8 local_70;
  Result flushResult;
  
  nowUsec = siamese::GetTimeUsec();
  LOCK();
  (this->LastTickUsec).super___atomic_base<unsigned_long>._M_i = nowUsec;
  UNLOCK();
  if (((((this->Deps).SocketRefCount)->Shutdown)._M_base._M_i & 1U) != 0) {
    std::__cxx11::string::string
              ((string *)&flushResult,"App shutdown in progress",(allocator *)&recoveryBytesSent);
    pEVar7 = (ErrorResult *)operator_new(0x38);
    pEVar7->Source = "Connection::onTimerTick";
    std::__cxx11::string::string((string *)&pEVar7->Description,(string *)&flushResult);
    pEVar7->Type = Tonk;
    pEVar7->Code = 0xc;
    _messageSent = pEVar7;
    RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,0xc,(Result *)&messageSent);
    Result::~Result((Result *)&messageSent);
    std::__cxx11::string::~string((string *)&flushResult);
  }
  if (((this->super_IConnection).SelfRefCount.Shutdown._M_base._M_i & 1U) != 0) {
    TVar5 = onDiscoTimerTick(this);
    return TVar5;
  }
  local_70 = &(this->super_IConnection).SelfRefCount;
  bVar4 = Timer::IsExpired(&this->NoDataTimer,nowUsec);
  if (bVar4) {
    std::__cxx11::string::string
              ((string *)&flushResult,"No data from peer (Connection timeout)",
               (allocator *)&recoveryBytesSent);
    pEVar7 = (ErrorResult *)operator_new(0x38);
    pEVar7->Source = "Connection::onTimerTick";
    std::__cxx11::string::string((string *)&pEVar7->Description,(string *)&flushResult);
    pEVar7->Type = Tonk;
    pEVar7->Code = 2;
    _messageSent = pEVar7;
    RefCounter::StartShutdown((RefCounter *)local_70,0xe,(Result *)&messageSent);
    Result::~Result((Result *)&messageSent);
    std::__cxx11::string::~string((string *)&flushResult);
  }
  else {
    this_00 = &this->Outgoing;
    if ((((this->Outgoing).LastAck.PeerNextExpectedSeqNum != (this->Outgoing).NextSequenceNumber) &&
        (uVar2 = (this->Outgoing).LastAck.ReceiveUsec, uVar2 != 0)) &&
       (0 < (long)((nowUsec - uVar2) + -300000))) {
      SenderBandwidthControl::Squelch(&this->SenderControl);
      if (this->RemoteAssignedIdForLocalHost != 0x7fffffff) {
        SessionOutgoing::StartHandshakeC2SUpdateSourceAddress
                  (this_00,this->EncryptionKey,this->RemoteAssignedIdForLocalHost);
      }
    }
    SenderBandwidthControl::RecalculateAvailableBytes(&this->SenderControl,nowUsec);
    ReceiverBandwidthControl::UpdateSendShape
              (&this->ReceiverControl,nowUsec,(this->CachedReceiverStats).TripUsec);
    pMVar3 = (this->Deps).MappedPort;
    if ((pMVar3 != (MappedPortLifetime *)0x0) &&
       (port = (pMVar3->ExternalMappedPort).super___atomic_base<unsigned_short>._M_i,
       this->LocalNATMapExternalPort != port)) {
      this->LocalNATMapExternalPort = port;
      sendNATMapPortToPeer(this,port);
    }
    if (((this->ConnectionEstablished)._M_base._M_i & 1U) == 0) {
      if (((this->Outgoing).HasPeerAddress._M_base._M_i & 1U) == 0) {
        return TickAgain;
      }
      bVar4 = Timer::IsExpired(&this->TimeSyncTimer,nowUsec);
      if (bVar4) {
        SessionOutgoing::QueueUnreliable
                  ((SessionOutgoing *)&stack0xffffffffffffffc8,(MessageType)this_00,(uint8_t *)0x4,0
                  );
        Result::~Result((Result *)&stack0xffffffffffffffc8);
      }
      SessionOutgoing::Flush((SessionOutgoing *)&flushResult);
      if (flushResult.Error != (ErrorResult *)0x0) {
        RefCounter::StartShutdown((RefCounter *)local_70,2,&flushResult);
      }
      Result::~Result(&flushResult);
      return TickAgain;
    }
    iVar9 = 0xb;
    do {
      iVar9 = iVar9 + -1;
      if (iVar9 == 0) goto LAB_00144328;
      _messageSent = _messageSent & 0xffffffffffffff00;
      SessionOutgoing::PostRetransmit((SessionOutgoing *)&flushResult,(bool *)this_00);
      if (flushResult.Error == (ErrorResult *)0x0) {
        bVar10 = messageSent ^ 1;
        cVar8 = messageSent;
      }
      else {
        RefCounter::StartShutdown((RefCounter *)local_70,2,&flushResult);
        bVar10 = 0;
        cVar8 = '\0';
      }
      Result::~Result(&flushResult);
    } while (cVar8 != '\0');
    if (bVar10 == 0) {
      return TickAgain;
    }
LAB_00144328:
    bVar4 = Timer::IsExpired(&this->TimeSyncTimer,nowUsec);
    if (bVar4) {
      onTimeSyncSendTimer(this);
    }
    bVar4 = Timer::IsExpired(&this->AcknowledgementTimer,nowUsec);
    if ((bVar4) || ((this->ReceiverControl).ShouldAckFast == true)) {
      onAckSendTimer(this,nowUsec);
    }
    bVar4 = Timer::IsExpired(&this->AppTimer,nowUsec);
    if (bVar4) {
      (*(this->ConnectionConfig).OnTick)
                ((this->ConnectionConfig).AppContextPtr,(TonkConnection)this,nowUsec);
    }
    SessionOutgoing::Flush((SessionOutgoing *)&flushResult);
    if (flushResult.Error != (ErrorResult *)0x0) {
      RefCounter::StartShutdown((RefCounter *)local_70,2,&flushResult);
    }
    uVar6 = SenderBandwidthControl::CalculateRecoverySendCount(&this->SenderControl,nowUsec);
    recoveryBytesSent = 0;
    while (bVar4 = uVar6 != 0, uVar6 = uVar6 - 1, bVar4) {
      SessionOutgoing::PostRecovery((SessionOutgoing *)&messageSent,(int *)this_00);
      if (recoveryBytesSent == 0) {
        if (_messageSent != (ErrorResult *)0x0) {
          RefCounter::StartShutdown((RefCounter *)local_70,8,(Result *)&messageSent);
        }
        Result::~Result((Result *)&messageSent);
        break;
      }
      Result::~Result((Result *)&messageSent);
    }
    if ((this->SocketConfig->Flags & 1) == 0) {
      do {
        if (((int)((uint)(this->SenderControl).ProbeSendTokens >> 1) < recoveryBytesSent) ||
           ((this->SenderControl).AvailableTokens.super___atomic_base<int>._M_i < recoveryBytesSent)
           ) break;
        SessionOutgoing::PostRecovery((SessionOutgoing *)&messageSent,(int *)this_00);
        iVar9 = recoveryBytesSent;
        if (recoveryBytesSent == 0) {
          if (_messageSent != (ErrorResult *)0x0) {
            RefCounter::StartShutdown((RefCounter *)local_70,8,(Result *)&messageSent);
          }
        }
        else {
          piVar1 = &(this->SenderControl).ProbeSendTokens;
          *piVar1 = *piVar1 + recoveryBytesSent * -2;
        }
        Result::~Result((Result *)&messageSent);
      } while (iVar9 != 0);
    }
    uVar6 = (this->SenderControl).ProbeSendTokens;
    while (((0xa27 < uVar6 &&
            (0x513 < (this->SenderControl).AvailableTokens.super___atomic_base<int>._M_i)) &&
           (bVar4 = SessionOutgoing::PostDummyDatagram(this_00), bVar4))) {
      uVar6 = (this->SenderControl).ProbeSendTokens - 0xa28;
      (this->SenderControl).ProbeSendTokens = uVar6;
    }
    Result::~Result(&flushResult);
  }
  return TickAgain;
}

Assistant:

Connection::TimerTickResult Connection::onTimerTick()
{
    const uint64_t nowUsec = GetTicksUsec();

#ifdef TONK_DETAILED_STATS
    // Cycle the detail statistics
    Deets.NextWrite();
    Deets.GetWritePtr()->TimestampUsec = nowUsec;
#endif // TONK_DETAILED_STATS

    // If the TonkConnection's parent TonkSocket is shut down:
    if (Deps.SocketRefCount->IsShutdown())
    {
        SelfRefCount.StartShutdown(
            Tonk_AppRequest,
            Result("Connection::onTimerTick", "App shutdown in progress", ErrorType::Tonk, Tonk_AppRequest));
    }

    // If this TonkConnection is disconnected:
    if (SelfRefCount.IsShutdown()) {
        return onDiscoTimerTick();
    }

    // If no data has been received for too long:
    if (NoDataTimer.IsExpired(nowUsec))
    {
        SelfRefCount.StartShutdown(
            Tonk_RemoteTimeout,
            Result("Connection::onTimerTick", "No data from peer (Connection timeout)"));
        return TimerTickResult::TickAgain;
    }

    // If peer should be sending acks but none are received:
    if (!Outgoing.PeerCaughtUp() &&
        Outgoing.GetLastAckReceiveUsec() != 0 &&
        (int64_t)(nowUsec - Outgoing.GetLastAckReceiveUsec() - protocol::kNoAckSquelchTimeoutUsec) > 0)
    {
        // Squelch sender
        SenderControl.Squelch();

        if (RemoteAssignedIdForLocalHost != TONK_INVALID_ID)
        {
            // In case this is a mobile hand-off, start sending source address update tags
            Outgoing.StartHandshakeC2SUpdateSourceAddress(
                EncryptionKey,
                RemoteAssignedIdForLocalHost);
        }
    }

    // Update bandwidth control
    SenderControl.RecalculateAvailableBytes(nowUsec);
    ReceiverControl.UpdateSendShape(nowUsec, CachedReceiverStats.TripUsec);

    // Update NAT external mapped port
    if (Deps.MappedPort)
    {
        const uint16_t externalMappedPort = Deps.MappedPort->ExternalMappedPort;
        if (LocalNATMapExternalPort != externalMappedPort)
        {
            LocalNATMapExternalPort = externalMappedPort;
            sendNATMapPortToPeer(externalMappedPort);
        }
    }

    // If connection is not established yet:
    if (!ConnectionEstablished)
    {
        // If there is no peer address yet, wait longer
        if (!Outgoing.IsPeerAddressValid()) {
            return TimerTickResult::TickAgain;
        }

        // If it is time to run time sync but no session is established:
        if (TimeSyncTimer.IsExpired(nowUsec))
        {
            /*
                Each outgoing datagram will have a handshake footer attached, so
                this code path just needs to make sure there is at least one
                message to send, and to flush datagrams
            */

            // Send a 0-byte padding message frame
            Outgoing.QueueUnreliable(protocol::MessageType_Padding, nullptr, 0);
        }

        // Flush all queued data
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        // Send at least one packet
        Result flushResult = Outgoing.Flush();
        if (flushResult.IsFail()) {
            SelfRefCount.StartShutdown(Tonk_Error, flushResult);
        }

        return TimerTickResult::TickAgain;
    }

    // Post retransmits up to the protocol limit before adding more data
    for (unsigned i = 0; i < protocol::kRetransmitLimit; ++i)
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        bool messageSent = false;
        Result retransmitResult = Outgoing.PostRetransmit(messageSent);

        if (retransmitResult.IsFail())
        {
            SelfRefCount.StartShutdown(Tonk_Error, retransmitResult);
            return TimerTickResult::TickAgain;
        }

        if (!messageSent) {
            break;
        }
    }

    /*
        TBD: Should application OnTick() and other things be running from an
        Asio green thread instead of blocking the rest of the code here?
        If the application significantly stalls the timer tick, for example,
        then it may cause inefficient use of the network.  And if the OnData()
        callback is called from a background thread then it would allow us
        to process FEC data in parallel.  Benchmarking needed here.
    */

    // If it is time to send a time sync message:
    if (TimeSyncTimer.IsExpired(nowUsec)) {
        onTimeSyncSendTimer();
    }

    /*
        This will emit a new acknowledgement either on a regular timer,
        or when the receiver bandwidth controller wants to emit a new
        rate control message for the sender to use.

        TBD: Should we gate this also on whether or not an acknowledgement
        might be needed?  Currently not because I do not want to decrease
        the rate at which we send bandwidth shape updates.
    */
    if (AcknowledgementTimer.IsExpired(nowUsec) ||
        (ReceiverControl.GetShouldAckFast()
         /* && Incoming.IsAckRequired() */))
    {
        onAckSendTimer(nowUsec);
    }

    // If it is time to invoke the application OnTick():
    if (AppTimer.IsExpired(nowUsec))
    {
        // Invoke application OnTick
        ConnectionConfig.OnTick(
            ConnectionConfig.AppContextPtr,
            reinterpret_cast<TonkConnection>(this),
            nowUsec);
    }

    // Flush all queued data
    TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
    Result flushResult = Outgoing.Flush();
    if (flushResult.IsFail()) {
        SelfRefCount.StartShutdown(Tonk_Error, flushResult);
    }

    //Logger.Info("this=", this, " AvailBytes = ", SenderControl.GetAvailableBytes(), " ProbeBytes = ", SenderControl.GetAvailableProbeBytes());

    // Calculate amount of recovery data we must send to protect data we've sent
    const unsigned recoveryCount = SenderControl.CalculateRecoverySendCount(nowUsec);
    int recoveryBytesSent = 0;
    for (unsigned i = 0; i < recoveryCount; ++i)
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        tonk::Result result = Outgoing.PostRecovery(recoveryBytesSent);

        // If recovery packet was not sent:
        if (recoveryBytesSent == 0)
        {
            if (result.IsFail()) {
                SelfRefCount.StartShutdown(Tonk_FECFailed, result);
            }
            break; // Stop here
        }
    }

    // If FEC is enabled for probing bandwidth:
    if ((SocketConfig->Flags & TONK_FLAGS_DISABLE_FEC_BW_PROBES) == 0)
    {
        while (SenderControl.ShouldSendProbe(recoveryBytesSent))
        {
            // Note that recovery packets do not subtract from the bandwidth for
            // app data, but app data subtracts from bandwidth used for probing.

            TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
            tonk::Result result = Outgoing.PostRecovery(recoveryBytesSent);

            // If recovery packet was not sent:
            if (recoveryBytesSent == 0)
            {
                if (result.IsFail()) {
                    SelfRefCount.StartShutdown(Tonk_FECFailed, result);
                }
                break; // Stop here
            }

            SenderControl.SpendProbeBytes(recoveryBytesSent);
        }
    }

    // While there is available bandwidth for more probing:
    while (SenderControl.ShouldSendProbe(protocol::kDummyBytes))
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        if (!Outgoing.PostDummyDatagram()) {
            break;
        }

        SenderControl.SpendProbeBytes(protocol::kDummyBytes);
    }

    return TimerTickResult::TickAgain;
}